

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGElemPush(xmlRelaxNGValidCtxtPtr ctxt,xmlRegExecCtxtPtr exec)

{
  int iVar1;
  int extraout_EAX;
  xmlRegExecCtxtPtr *ppxVar2;
  int iVar3;
  
  ppxVar2 = ctxt->elemTab;
  if (ppxVar2 == (xmlRegExecCtxtPtr *)0x0) {
    ctxt->elemMax = 10;
    ppxVar2 = (xmlRegExecCtxtPtr *)(*xmlMalloc)(0x50);
    ctxt->elemTab = ppxVar2;
    if (ppxVar2 == (xmlRegExecCtxtPtr *)0x0) goto LAB_0017d0f6;
  }
  iVar3 = ctxt->elemNr;
  iVar1 = ctxt->elemMax;
  if (iVar1 <= iVar3) {
    ctxt->elemMax = iVar1 * 2;
    ppxVar2 = (xmlRegExecCtxtPtr *)(*xmlRealloc)(ppxVar2,(long)iVar1 << 4);
    ctxt->elemTab = ppxVar2;
    if (ppxVar2 == (xmlRegExecCtxtPtr *)0x0) {
LAB_0017d0f6:
      xmlRngVErrMemory(ctxt);
      return extraout_EAX;
    }
    iVar3 = ctxt->elemNr;
  }
  ctxt->elemNr = iVar3 + 1;
  ppxVar2[iVar3] = exec;
  ctxt->elem = exec;
  return (int)ppxVar2;
}

Assistant:

static int
xmlRelaxNGElemPush(xmlRelaxNGValidCtxtPtr ctxt, xmlRegExecCtxtPtr exec)
{
    if (ctxt->elemTab == NULL) {
        ctxt->elemMax = 10;
        ctxt->elemTab = (xmlRegExecCtxtPtr *) xmlMalloc(ctxt->elemMax *
                                                        sizeof
                                                        (xmlRegExecCtxtPtr));
        if (ctxt->elemTab == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
    }
    if (ctxt->elemNr >= ctxt->elemMax) {
        ctxt->elemMax *= 2;
        ctxt->elemTab = (xmlRegExecCtxtPtr *) xmlRealloc(ctxt->elemTab,
                                                         ctxt->elemMax *
                                                         sizeof
                                                         (xmlRegExecCtxtPtr));
        if (ctxt->elemTab == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
    }
    ctxt->elemTab[ctxt->elemNr++] = exec;
    ctxt->elem = exec;
    return (0);
}